

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseSpecifierQualifierList
          (Parser *this,DeclarationSyntax **decl,SpecifierListSyntax **specList)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *pSVar3;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar4;
  SpecifierSyntax *local_40;
  SpecifierSyntax *spec;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> **ppSStack_30;
  bool seenType;
  SpecifierListSyntax **specList_cur;
  SpecifierListSyntax **specList_local;
  DeclarationSyntax **decl_local;
  Parser *this_local;
  
  spec._7_1_ = 0;
  ppSStack_30 = specList;
  specList_cur = specList;
  specList_local = (SpecifierListSyntax **)decl;
  decl_local = (DeclarationSyntax **)this;
  do {
    local_40 = (SpecifierSyntax *)0x0;
    pSVar3 = peek(this,1);
    SVar2 = SyntaxToken::kind(pSVar3);
    switch(SVar2) {
    case IdentifierToken:
      if ((spec._7_1_ & 1) != 0) {
        return true;
      }
      spec._7_1_ = 1;
      parseTypedefName_AtFirst(this,&local_40);
      break;
    default:
      if (ppSStack_30 == specList_cur) {
        DiagnosticsReporter::ExpectedFIRSTofSpecifierQualifier(&this->diagReporter_);
        return false;
      }
      return true;
    case Keyword_char:
    case Keyword_double:
    case Keyword_float:
    case Keyword_int:
    case Keyword_long:
    case Keyword_short:
    case KeywordAlias___signed:
    case Keyword_unsigned:
    case Keyword_Ext_wchar_t:
    case KeywordAlias_Bool:
    case Keyword__Complex:
    case Keyword_Ext_char16_t:
    case Keyword_Ext_char32_t:
    case Keyword_ExtGNU___complex__:
      spec._7_1_ = 1;
      parseTrivialSpecifier_AtFirst<psy::C::BasicTypeSpecifierSyntax>
                (this,&local_40,BasicTypeSpecifier);
      break;
    case KeywordAlias___const:
      parseTrivialSpecifier_AtFirst<psy::C::TypeQualifierSyntax>(this,&local_40,ConstQualifier);
      break;
    case Keyword_enum:
      spec._7_1_ = 1;
      bVar1 = parseTagTypeSpecifier_AtFirst<psy::C::EnumDeclarationSyntax>
                        (this,(DeclarationSyntax **)specList_local,&local_40,EnumDeclaration,
                         EnumTypeSpecifier,0x4063f0);
      if (!bVar1) {
        return false;
      }
      break;
    case KeywordAlias___restrict:
      parseTrivialSpecifier_AtFirst<psy::C::TypeQualifierSyntax>(this,&local_40,RestrictQualifier);
      break;
    case Keyword_struct:
      spec._7_1_ = 1;
      bVar1 = parseTagTypeSpecifier_AtFirst<psy::C::StructOrUnionDeclarationSyntax>
                        (this,(DeclarationSyntax **)specList_local,&local_40,StructDeclaration,
                         StructTypeSpecifier,0x405ef0);
      if (!bVar1) {
        return false;
      }
      break;
    case Keyword_union:
      spec._7_1_ = 1;
      bVar1 = parseTagTypeSpecifier_AtFirst<psy::C::StructOrUnionDeclarationSyntax>
                        (this,(DeclarationSyntax **)specList_local,&local_40,UnionDeclaration,
                         UnionTypeSpecifier,0x405ef0);
      if (!bVar1) {
        return false;
      }
      break;
    case Keyword_void:
      spec._7_1_ = 1;
      parseTrivialSpecifier_AtFirst<psy::C::VoidTypeSpecifierSyntax>(this,&local_40);
      break;
    case ENDof_KeywordOrPunctuatorToken:
      parseTrivialSpecifier_AtFirst<psy::C::TypeQualifierSyntax>(this,&local_40,VolatileQualifier);
      break;
    case KeywordAlias___alignas:
      bVar1 = parseAlignmentSpecifier_AtFirst(this,&local_40);
      if (!bVar1) {
        return false;
      }
      break;
    case Keyword__Atomic:
      pSVar3 = peek(this,2);
      SVar2 = SyntaxToken::kind(pSVar3);
      if (SVar2 == OpenParenToken) {
        bVar1 = parseAtomicTypeSpecifier_AtFirst(this,&local_40);
        if (!bVar1) {
          return false;
        }
        spec._7_1_ = 1;
      }
      else {
        parseTrivialSpecifier_AtFirst<psy::C::TypeQualifierSyntax>(this,&local_40,AtomicQualifier);
      }
      break;
    case KeywordAlias___attribute:
      bVar1 = parseExtGNU_AttributeSpecifier_AtFirst(this,&local_40);
      if (!bVar1) {
        return false;
      }
      break;
    case KeywordAlias___typeof:
      bVar1 = parseExtGNU_Typeof_AtFirst(this,&local_40);
      if (!bVar1) {
        return false;
      }
    }
    pSVar4 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::SpecifierSyntax*&>
                       (this,&local_40);
    *ppSStack_30 = pSVar4;
    ppSStack_30 = &((*ppSStack_30)->
                   super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   ).
                   super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .next;
  } while (*specList_local == (SpecifierListSyntax *)0x0);
  bVar1 = parseTypeQualifiersAndAttributes(this,ppSStack_30);
  return bVar1;
}

Assistant:

bool Parser::parseSpecifierQualifierList(DeclarationSyntax*& decl,
                                         SpecifierListSyntax*& specList)
{
    DBG_THIS_RULE();

    SpecifierListSyntax** specList_cur = &specList;
    bool seenType = false;
    while (true) {
        SpecifierSyntax* spec = nullptr;
        switch (peek().kind()) {
            // declaration-specifiers -> type-qualifier
            case SyntaxKind::Keyword_const:
                parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                            spec,
                            SyntaxKind::ConstQualifier);
                break;

            case SyntaxKind::Keyword_volatile:
                parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                            spec,
                            SyntaxKind::VolatileQualifier);
                break;

            case SyntaxKind::Keyword_restrict:
                parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                            spec,
                            SyntaxKind::RestrictQualifier);
                break;

            // declaration-specifiers -> type-qualifier -> `_Atomic'
            // declaration-specifiers -> type-specifier -> `_Atomic' `('
            case SyntaxKind::Keyword__Atomic:
                if (peek(2).kind() == SyntaxKind::OpenParenToken) {
                    if (!parseAtomicTypeSpecifier_AtFirst(spec))
                        return false;
                    seenType = true;
                }
                else
                    parseTrivialSpecifier_AtFirst<TypeQualifierSyntax>(
                                spec,
                                SyntaxKind::AtomicQualifier);
                break;

            // declaration-specifiers -> type-specifier -> void
            case SyntaxKind::Keyword_void:
                seenType = true;
                parseTrivialSpecifier_AtFirst<VoidTypeSpecifierSyntax>(spec);
                break;

            // declaration-specifiers -> type-specifier -> basic types
            case SyntaxKind::Keyword_char:
            case SyntaxKind::Keyword_short:
            case SyntaxKind::Keyword_int:
            case SyntaxKind::Keyword_long:
            case SyntaxKind::Keyword_float:
            case SyntaxKind::Keyword_double:
            case SyntaxKind::Keyword__Bool:
            case SyntaxKind::Keyword__Complex:
            case SyntaxKind::Keyword_signed:
            case SyntaxKind::Keyword_unsigned:
            case SyntaxKind::Keyword_Ext_char16_t:
            case SyntaxKind::Keyword_Ext_char32_t:
            case SyntaxKind::Keyword_Ext_wchar_t:
            case SyntaxKind::Keyword_ExtGNU___complex__:
                seenType = true;
                parseTrivialSpecifier_AtFirst<BasicTypeSpecifierSyntax>(
                            spec,
                            SyntaxKind::BasicTypeSpecifier);
                break;

            // declaration-specifiers -> type-specifier ->* `struct'
            case SyntaxKind::Keyword_struct:
                seenType = true;
                if (!parseTagTypeSpecifier_AtFirst<StructOrUnionDeclarationSyntax>(
                            decl,
                            spec,
                            SyntaxKind::StructDeclaration,
                            SyntaxKind::StructTypeSpecifier,
                            &Parser::parseStructDeclaration))
                    return false;
                break;

            // declaration-specifiers -> type-specifier ->* `union'
            case SyntaxKind::Keyword_union:
                seenType = true;
                if (!parseTagTypeSpecifier_AtFirst<StructOrUnionDeclarationSyntax>(
                            decl,
                            spec,
                            SyntaxKind::UnionDeclaration,
                            SyntaxKind::UnionTypeSpecifier,
                            &Parser::parseStructDeclaration))
                    return false;
                break;

            // declaration-specifiers -> type-specifier -> enum-specifier
            case SyntaxKind::Keyword_enum:
                seenType = true;
                if (!parseTagTypeSpecifier_AtFirst<EnumDeclarationSyntax>(
                            decl,
                            spec,
                            SyntaxKind::EnumDeclaration,
                            SyntaxKind::EnumTypeSpecifier,
                            &Parser::parseEnumerator))
                    return false;
                break;

            // declaration-specifiers -> type-specifier -> typedef-name
            case SyntaxKind::IdentifierToken: {
                if (seenType)
                    return true;
                seenType = true;
                parseTypedefName_AtFirst(spec);
                break;
            }

            // declaration-specifiers -> alignment-specifier
            case SyntaxKind::Keyword__Alignas:
                if (!parseAlignmentSpecifier_AtFirst(spec))
                    return false;
                break;

            // declaration-specifiers -> GNU-attribute-specifier
            case SyntaxKind::Keyword_ExtGNU___attribute__:
                if (!parseExtGNU_AttributeSpecifier_AtFirst(spec))
                    return false;
                break;

            // declaration-specifiers -> GNU-typeof-specifier
            case SyntaxKind::Keyword_ExtGNU___typeof__:
                if (!parseExtGNU_Typeof_AtFirst(spec))
                    return false;
                break;

            default:
                if (specList_cur == &specList) {
                    diagReporter_.ExpectedFIRSTofSpecifierQualifier();
                    return false;
                }
                return true;
        }

        *specList_cur = makeNode<SpecifierListSyntax>(spec);
        specList_cur = &(*specList_cur)->next;

        if (decl)
            return parseTypeQualifiersAndAttributes(*specList_cur);
    }
}